

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O1

Abc_Ntk_t * Abc_NtkCreateWithNode(char *pSop)

{
  uint uVar1;
  int iVar2;
  Abc_Ntk_t *pNtk;
  char *pcVar3;
  void **ppvVar4;
  Vec_Ptr_t *pVVar5;
  Abc_Obj_t *pAVar6;
  Abc_Obj_t *pObj;
  long lVar7;
  ulong uVar8;
  
  pNtk = Abc_NtkAlloc(ABC_NTK_LOGIC,ABC_FUNC_SOP,1);
  pcVar3 = Extra_UtilStrsav("ex");
  pNtk->pName = pcVar3;
  pVVar5 = pNtk->vObjs;
  uVar1 = pVVar5->nCap;
  if (pVVar5->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (pVVar5->pArray == (void **)0x0) {
        ppvVar4 = (void **)malloc(0x80);
      }
      else {
        ppvVar4 = (void **)realloc(pVVar5->pArray,0x80);
      }
      pVVar5->pArray = ppvVar4;
      iVar2 = 0x10;
    }
    else {
      iVar2 = uVar1 * 2;
      if (iVar2 <= (int)uVar1) goto LAB_00860efe;
      if (pVVar5->pArray == (void **)0x0) {
        ppvVar4 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar4 = (void **)realloc(pVVar5->pArray,(ulong)uVar1 << 4);
      }
      pVVar5->pArray = ppvVar4;
    }
    pVVar5->nCap = iVar2;
  }
LAB_00860efe:
  iVar2 = pVVar5->nSize;
  pVVar5->nSize = iVar2 + 1;
  pVVar5->pArray[iVar2] = (void *)0x0;
  uVar1 = Abc_SopGetVarNum(pSop);
  pVVar5 = Abc_NodeGetFakeNames(uVar1);
  if (0 < (int)uVar1) {
    uVar8 = 0;
    do {
      pAVar6 = Abc_NtkCreateObj(pNtk,ABC_OBJ_PI);
      if ((long)pVVar5->nSize <= (long)uVar8) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      Abc_ObjAssignName(pAVar6,(char *)pVVar5->pArray[uVar8],(char *)0x0);
      uVar8 = uVar8 + 1;
    } while (uVar1 != uVar8);
  }
  Abc_NodeFreeNames(pVVar5);
  pAVar6 = Abc_NtkCreateObj(pNtk,ABC_OBJ_NODE);
  pVVar5 = pNtk->vPis;
  if (0 < pVVar5->nSize) {
    lVar7 = 0;
    do {
      Abc_ObjAddFanin(pAVar6,(Abc_Obj_t *)pVVar5->pArray[lVar7]);
      lVar7 = lVar7 + 1;
      pVVar5 = pNtk->vPis;
    } while (lVar7 < pVVar5->nSize);
  }
  pcVar3 = Abc_SopRegister((Mem_Flex_t *)pNtk->pManFunc,pSop);
  (pAVar6->field_5).pData = pcVar3;
  pObj = Abc_NtkCreateObj(pNtk,ABC_OBJ_PO);
  Abc_ObjAddFanin(pObj,pAVar6);
  Abc_ObjAssignName(pObj,"F",(char *)0x0);
  iVar2 = Abc_NtkCheck(pNtk);
  if (iVar2 == 0) {
    fwrite("Abc_NtkCreateWithNode(): Network check has failed.\n",0x33,1,_stdout);
  }
  return pNtk;
}

Assistant:

Abc_Ntk_t * Abc_NtkCreateWithNode( char * pSop )
{    
    Abc_Ntk_t * pNtkNew; 
    Abc_Obj_t * pFanin, * pNode, * pNodePo;
    Vec_Ptr_t * vNames;
    int i, nVars;
    // start the network
    pNtkNew = Abc_NtkAlloc( ABC_NTK_LOGIC, ABC_FUNC_SOP, 1 );
    pNtkNew->pName = Extra_UtilStrsav("ex");
    // create PIs
    Vec_PtrPush( pNtkNew->vObjs, NULL );
    nVars = Abc_SopGetVarNum( pSop );
    vNames = Abc_NodeGetFakeNames( nVars );
    for ( i = 0; i < nVars; i++ )
        Abc_ObjAssignName( Abc_NtkCreatePi(pNtkNew), (char *)Vec_PtrEntry(vNames, i), NULL );
    Abc_NodeFreeNames( vNames );
    // create the node, add PIs as fanins, set the function
    pNode = Abc_NtkCreateNode( pNtkNew );
    Abc_NtkForEachPi( pNtkNew, pFanin, i )
        Abc_ObjAddFanin( pNode, pFanin );
    pNode->pData = Abc_SopRegister( (Mem_Flex_t *)pNtkNew->pManFunc, pSop );
    // create the only PO
    pNodePo = Abc_NtkCreatePo(pNtkNew);
    Abc_ObjAddFanin( pNodePo, pNode );
    Abc_ObjAssignName( pNodePo, "F", NULL );
    if ( !Abc_NtkCheck( pNtkNew ) )
        fprintf( stdout, "Abc_NtkCreateWithNode(): Network check has failed.\n" );
    return pNtkNew;
}